

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

void ma_pcm_s16_to_s16(void *dst,void *src,ma_uint64 count,ma_dither_mode ditherMode)

{
  ma_dither_mode ditherMode_local;
  ma_uint64 count_local;
  void *src_local;
  void *dst_local;
  ma_uint64 bytesToCopyNow;
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = src;
  local_10 = dst;
  for (bytesToCopyNow = count << 1; bytesToCopyNow != 0;
      bytesToCopyNow = bytesToCopyNow - (long)dst_local) {
    dst_local = (void *)bytesToCopyNow;
    if (0xffffffff < bytesToCopyNow) {
      dst_local = (void *)0xffffffff;
    }
    memcpy(local_10,local_18,(size_t)dst_local);
    local_10 = (void *)((long)local_10 + (long)dst_local);
    local_18 = (void *)((long)local_18 + (long)dst_local);
  }
  return;
}

Assistant:

MA_API void ma_pcm_s16_to_s16(void* dst, const void* src, ma_uint64 count, ma_dither_mode ditherMode)
{
    (void)ditherMode;
    ma_copy_memory_64(dst, src, count * sizeof(ma_int16));
}